

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O0

void fekete_subrule_7(int suborder_num,double *suborder_xyz,double *suborder_w)

{
  int local_24;
  int s;
  double *suborder_w_local;
  double *suborder_xyz_local;
  int suborder_num_local;
  
  for (local_24 = 0; local_24 < suborder_num; local_24 = local_24 + 1) {
    suborder_xyz[local_24 * 3] = fekete_subrule_7::suborder_xy_rule_7[local_24 * 3];
    suborder_xyz[local_24 * 3 + 1] = fekete_subrule_7::suborder_xy_rule_7[local_24 * 3 + 1];
    suborder_xyz[local_24 * 3 + 2] = fekete_subrule_7::suborder_xy_rule_7[local_24 * 3 + 2];
  }
  for (local_24 = 0; local_24 < suborder_num; local_24 = local_24 + 1) {
    suborder_w[local_24] = fekete_subrule_7::suborder_w_rule_7[local_24];
  }
  return;
}

Assistant:

void fekete_subrule_7 ( int suborder_num, double suborder_xyz[], 
  double suborder_w[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEKETE_SUBRULE_7 returns a compressed Fekete rule 7.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    05 October 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Mark Taylor, Beth Wingate, Rachel Vincent,
//    An Algorithm for Computing Fekete Points in the Triangle,
//    SIAM Journal on Numerical Analysis,
//    Volume 38, Number 5, 2000, pages 1707-1720.
//
//  Parameters:
//
//    Input, int SUBORDER_NUM, the number of suborders of the rule.
//
//    Output, double SUBORDER_XYZ[3*SUBORDER_NUM], contains
//    Output, double SUBORDER_XYZ[3*SUBORDER_NUM],
//    the barycentric coordinates of the abscissas.
//
//    Output, double SUBORDER_W[SUBORDER_NUM], the suborder weights.
//
{
  int s;
  static double suborder_xy_rule_7[3*38] = {
      0.3333333333,  0.3333333333, 0.3333333334, 
      0.2515553103,  0.3292984162, 0.4191462735, 
      0.3292984162,  0.2515553103, 0.4191462735, 
      0.1801930996,  0.4099034502, 0.4099034502, 
      0.2438647767,  0.2438647767, 0.5122704466, 
      0.1512564554,  0.1512564554, 0.6974870892, 
      0.0810689493,  0.4594655253, 0.4594655254, 
      0.0832757649,  0.0832757649, 0.8334484702, 
      0.0369065587,  0.0369065587, 0.9261868826, 
      0.0149574850,  0.0149574850, 0.9700850300, 
      0.0000000000,  0.5000000000, 0.5000000000, 
      0.0000000000,  0.0000000000, 1.0000000000, 
      0.1821465920,  0.3095465041, 0.5083069039, 
      0.1246901255,  0.3789288931, 0.4963809814, 
      0.1179441386,  0.2868915642, 0.5951642972, 
      0.1639418454,  0.2204868669, 0.6155712877, 
      0.0742549663,  0.3532533654, 0.5724916683, 
      0.0937816771,  0.2191980979, 0.6870202250, 
      0.0890951387,  0.1446273457, 0.7662775156, 
      0.0409065243,  0.4360543636, 0.5230391121, 
      0.0488675890,  0.2795984854, 0.6715339256, 
      0.0460342127,  0.2034211147, 0.7505446726, 
      0.0420687187,  0.1359040280, 0.8220272533, 
      0.0116377940,  0.4336892286, 0.5546729774, 
      0.0299062187,  0.3585587824, 0.6115349989, 
      0.0132313129,  0.2968103667, 0.6899583204, 
      0.0136098469,  0.2050279257, 0.7813622274, 
      0.0124869684,  0.1232146223, 0.8642984093, 
      0.0365197797,  0.0805854893, 0.8828947310, 
      0.0118637765,  0.0554881302, 0.9326480933, 
      0.0000000000,  0.4154069883, 0.5845930117, 
      0.0000000000,  0.3332475761, 0.6667524239, 
      0.0000000000,  0.2558853572, 0.7441146428, 
      0.0000000000,  0.1855459314, 0.8144540686, 
      0.0000000000,  0.1242528987, 0.8757471013, 
      0.0000000000,  0.0737697111, 0.9262302889, 
      0.0000000000,  0.0355492359, 0.9644507641, 
      0.0000000000,  0.0106941169, 0.9893058831 };
  static double suborder_w_rule_7[38] = {
      0.0326079297, 
      0.0255331366, 
      0.0255331366, 
      0.0288093886, 
      0.0279490452, 
      0.0174438045, 
      0.0203594338, 
      0.0113349170, 
      0.0046614185, 
      0.0030346239, 
      0.0012508731, 
      0.0000782945, 
      0.0235716330, 
      0.0206304700, 
      0.0204028340, 
      0.0215105697, 
      0.0183482070, 
      0.0174161032, 
      0.0155972434, 
      0.0119269616, 
      0.0147074804, 
      0.0116182830, 
      0.0087639138, 
      0.0098563528, 
      0.0096342355, 
      0.0086477936, 
      0.0083868302, 
      0.0062576643, 
      0.0077839825, 
      0.0031415239, 
      0.0006513246, 
      0.0021137942, 
      0.0004393452, 
      0.0013662119, 
      0.0003331251, 
      0.0011613225, 
      0.0004342867, 
      0.0002031499 };

  for ( s = 0; s < suborder_num; s++ )
  {
    suborder_xyz[0+s*3] = suborder_xy_rule_7[0+s*3];
    suborder_xyz[1+s*3] = suborder_xy_rule_7[1+s*3];
    suborder_xyz[2+s*3] = suborder_xy_rule_7[2+s*3];
  }

  for ( s = 0; s < suborder_num; s++ )
  {
    suborder_w[s] = suborder_w_rule_7[s];
  }

  return;
}